

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

Color ColorContrast(Color color,float contrast)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = -1.0;
  if ((-1.0 <= contrast) && (fVar1 = contrast, 1.0 < contrast)) {
    fVar1 = 1.0;
  }
  fVar2 = (fVar1 + 1.0) * (fVar1 + 1.0);
  fVar3 = (((float)((uint)color & 0xff) / 255.0 + -0.5) * fVar2 + 0.5) * 255.0;
  fVar1 = 0.0;
  if ((0.0 <= fVar3) && (fVar1 = fVar3, 255.0 < fVar3)) {
    fVar1 = 255.0;
  }
  fVar4 = (((float)((uint)color >> 8 & 0xff) / 255.0 + -0.5) * fVar2 + 0.5) * 255.0;
  fVar3 = 0.0;
  if ((0.0 <= fVar4) && (fVar3 = fVar4, 255.0 < fVar4)) {
    fVar3 = 255.0;
  }
  fVar4 = (((float)((uint)color >> 0x10 & 0xff) / 255.0 + -0.5) * fVar2 + 0.5) * 255.0;
  fVar2 = 0.0;
  if ((0.0 <= fVar4) && (fVar2 = fVar4, 255.0 < fVar4)) {
    fVar2 = 255.0;
  }
  return (Color)((int)fVar1 & 0xffU |
                ((int)fVar3 & 0xffU) << 8 | ((int)fVar2 & 0xffU) << 0x10 | (uint)color & 0xff000000)
  ;
}

Assistant:

Color ColorContrast(Color color, float contrast)
{
    Color result = color;

    if (contrast < -1.0f) contrast = -1.0f;
    else if (contrast > 1.0f) contrast = 1.0f;

    contrast = (1.0f + contrast);
    contrast *= contrast;

    float pR = (float)color.r/255.0f;
    pR -= 0.5f;
    pR *= contrast;
    pR += 0.5f;
    pR *= 255;
    if (pR < 0) pR = 0;
    else if (pR > 255) pR = 255;

    float pG = (float)color.g/255.0f;
    pG -= 0.5f;
    pG *= contrast;
    pG += 0.5f;
    pG *= 255;
    if (pG < 0) pG = 0;
    else if (pG > 255) pG = 255;

    float pB = (float)color.b/255.0f;
    pB -= 0.5f;
    pB *= contrast;
    pB += 0.5f;
    pB *= 255;
    if (pB < 0) pB = 0;
    else if (pB > 255) pB = 255;

    result.r = (unsigned char)pR;
    result.g = (unsigned char)pG;
    result.b = (unsigned char)pB;

    return result;
}